

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::Reset(ByteCodeWriter *this)

{
  SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  DataChunk *pDVar2;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  Type pSVar5;
  CallRegToLdFldCacheIndexMap *pCVar6;
  code *pcVar7;
  DataChunk *pDVar8;
  bool bVar9;
  undefined4 *puVar10;
  Type pSVar11;
  
  this->isInUse = false;
  if (this->isInitialized == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x10d,"(isInitialized)","isInitialized");
    if (!bVar9) {
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar10 = 0;
  }
  (this->m_byteCodeData).currentOffset = 0;
  pDVar2 = (this->m_byteCodeData).head;
  pDVar8 = pDVar2;
  while (pDVar8 != (DataChunk *)0x0) {
    pDVar8->currentByte = pDVar8->buffer;
    pDVar8 = pDVar8->nextChunk;
  }
  (this->m_byteCodeData).current = pDVar2;
  (this->m_auxiliaryData).currentOffset = 0;
  pDVar2 = (this->m_auxiliaryData).head;
  pDVar8 = pDVar2;
  while (pDVar8 != (DataChunk *)0x0) {
    pDVar8->currentByte = pDVar8->buffer;
    pDVar8 = pDVar8->nextChunk;
  }
  (this->m_auxiliaryData).current = pDVar2;
  (this->m_auxContextData).currentOffset = 0;
  pDVar2 = (this->m_auxContextData).head;
  pDVar8 = pDVar2;
  while (pDVar8 != (DataChunk *)0x0) {
    pDVar8->currentByte = pDVar8->buffer;
    pDVar8 = pDVar8->nextChunk;
  }
  (this->m_auxContextData).current = pDVar2;
  this->lastOpcode = FunctionEntry;
  UpdateNextBranchIslandOffset(this,0,0);
  (this->m_longJumpOffsets->
  super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>).count =
       0;
  pLVar3 = this->m_labelOffsets;
  (pLVar3->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (this->m_jumpOffsets->
  super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>).count =
       0;
  (this->m_loopHeaders->
  super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  pSVar1 = &this->rootObjectLoadInlineCacheOffsets;
  pSVar11 = (this->rootObjectLoadInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.
            next;
  if ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar11 != pSVar1) {
    pAVar4 = &((pLVar3->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
              alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    do {
      pSVar5 = pSVar11->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (pAVar4,pSVar11,0x10);
      pSVar11 = pSVar5;
    } while ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar5 != pSVar1);
  }
  (this->rootObjectLoadInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->rootObjectLoadInlineCacheOffsets).super_RealCount.count = 0;
  pSVar1 = &this->rootObjectStoreInlineCacheOffsets;
  pSVar11 = (this->rootObjectStoreInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.
            next;
  if ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar11 != pSVar1) {
    pAVar4 = &((this->m_labelOffsets->
               super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    do {
      pSVar5 = pSVar11->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (pAVar4,pSVar11,0x10);
      pSVar11 = pSVar5;
    } while ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar5 != pSVar1);
  }
  (this->rootObjectStoreInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->rootObjectStoreInlineCacheOffsets).super_RealCount.count = 0;
  pSVar1 = &this->rootObjectLoadMethodInlineCacheOffsets;
  pSVar11 = (this->rootObjectLoadMethodInlineCacheOffsets).
            super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar11 != pSVar1) {
    pAVar4 = &((this->m_labelOffsets->
               super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    do {
      pSVar5 = pSVar11->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (pAVar4,pSVar11,0x10);
      pSVar11 = pSVar5;
    } while ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)pSVar5 != pSVar1);
  }
  (this->rootObjectLoadMethodInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->rootObjectLoadMethodInlineCacheOffsets).super_RealCount.count = 0;
  pCVar6 = this->callRegToLdFldCacheIndexMap;
  pCVar6->size = 0;
  pCVar6->bucketCount = 0;
  pCVar6->count = 0;
  pCVar6->freeCount = 0;
  pCVar6->modFunctionIndex = 0x4b;
  pCVar6->buckets = (Type)0x0;
  pCVar6->entries = (Type)0x0;
  this->m_pMatchingNode = (ParseNode *)0x0;
  this->m_matchingNodeRefCount = 0;
  this->m_functionWrite = (FunctionBody *)0x0;
  this->m_currentDebuggerScope = (DebuggerScope *)0x0;
  this->m_loopNest = 0;
  this->m_byteCodeCount = 0;
  this->m_byteCodeWithoutLDACount = 0;
  this->m_byteCodeInLoopCount = 0;
  return;
}

Assistant:

void ByteCodeWriter::Reset()
    {
        DebugOnly(isInUse = false);
        Assert(isInitialized);
        m_byteCodeData.Reset();
        m_auxiliaryData.Reset();
        m_auxContextData.Reset();
#ifdef BYTECODE_BRANCH_ISLAND
        lastOpcode = Js::OpCode::FunctionEntry;
        this->UpdateNextBranchIslandOffset(0, 0);
        m_longJumpOffsets->Clear();
#endif
        m_labelOffsets->Clear();
        m_jumpOffsets->Clear();
        m_loopHeaders->Clear();
        rootObjectLoadInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        rootObjectStoreInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        rootObjectLoadMethodInlineCacheOffsets.Clear(m_labelOffsets->GetAllocator());
        callRegToLdFldCacheIndexMap->ResetNoDelete();
        m_pMatchingNode = nullptr;
        m_matchingNodeRefCount = 0;
        m_functionWrite = nullptr;
        m_byteCodeCount = 0;
        m_byteCodeWithoutLDACount = 0;
        m_byteCodeInLoopCount = 0;
        m_loopNest = 0;
        m_currentDebuggerScope = nullptr;
    }